

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O2

crn_header * crnd::crnd_get_header(void *pData,uint32 data_size)

{
  uint uVar1;
  crn_header *pcVar2;
  
  if (data_size < 0x4a || pData == (void *)0x0) {
    return (crn_header *)0x0;
  }
  if (((ushort)(*pData << 8 | *pData >> 8) == 0x4878) &&
     (0x49 < (ushort)(*(ushort *)((long)pData + 2) << 8 | *(ushort *)((long)pData + 2) >> 8))) {
    uVar1 = crn_packed_uint::operator_cast_to_unsigned_int((crn_packed_uint<4U> *)((long)pData + 6))
    ;
    pcVar2 = (crn_header *)0x0;
    if (uVar1 <= data_size) {
      pcVar2 = (crn_header *)pData;
    }
  }
  else {
    pcVar2 = (crn_header *)0x0;
  }
  return pcVar2;
}

Assistant:

const crn_header* crnd_get_header(const void* pData, uint32 data_size)
    {
        if ((!pData) || (data_size < sizeof(crn_header)))
            return NULL;

        const crn_header& file_header = *static_cast<const crn_header*>(pData);
        if (file_header.m_sig != crn_header::cCRNSigValue)
            return NULL;

        if ((file_header.m_header_size < sizeof(crn_header)) || (data_size < file_header.m_data_size))
            return NULL;

        return &file_header;
    }